

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraImp.c
# Opt level: O3

void Fra_ImpCompactArray(Vec_Int_t *vImps)

{
  int iVar1;
  int *piVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  
  uVar4 = vImps->nSize;
  if ((int)uVar4 < 1) {
    uVar3 = 0;
  }
  else {
    piVar2 = vImps->pArray;
    lVar6 = 0;
    uVar3 = 0;
    do {
      iVar1 = piVar2[lVar6];
      if (iVar1 != 0) {
        if (((int)uVar3 < 0) || (uVar4 <= uVar3)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        uVar5 = (ulong)uVar3;
        uVar3 = uVar3 + 1;
        piVar2[uVar5] = iVar1;
        uVar4 = vImps->nSize;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < (int)uVar4);
  }
  if ((int)uVar4 < (int)uVar3) {
    __assert_fail("p->nSize >= nSizeNew",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
  }
  vImps->nSize = uVar3;
  return;
}

Assistant:

void Fra_ImpCompactArray( Vec_Int_t * vImps )
{
    int i, k, Imp;
    k = 0;
    Vec_IntForEachEntry( vImps, Imp, i )
        if ( Imp )
            Vec_IntWriteEntry( vImps, k++, Imp );
    Vec_IntShrink( vImps, k );
}